

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O3

bool __thiscall wasm::anon_unknown_0::SubTyper::isSubType(SubTyper *this,HeapType a,HeapType b)

{
  BasicHeapType BVar1;
  SubTyper *pSVar2;
  uint uVar3;
  byte bVar4;
  HeapType local_28;
  HeapType a_local;
  HeapType b_local;
  
  bVar4 = 1;
  if (this == (SubTyper *)a.id) goto LAB_00cadd97;
  if (this < (SubTyper *)0x7d) {
    uVar3 = (uint)(((ulong)this & 4) == 0);
  }
  else {
    uVar3 = *(uint *)(this + 4);
  }
  local_28.id = (uintptr_t)this;
  a_local.id = a.id;
  if (a.id < 0x7d) {
    if (SUB41(((uint)a.id & 4) >> 2,0) == (uVar3 == 0)) {
      BVar1 = HeapType::getUnsharedTop(&local_28);
      pSVar2 = (SubTyper *)(ulong)((uint)this & 0x7b);
      if ((SubTyper *)0x7c < this) {
        pSVar2 = this;
      }
      uVar3 = (uint)a.id & 0x7b;
      switch(uVar3 << 0x1d | uVar3 - 8 >> 3) {
      case 0:
        bVar4 = BVar1 == ext;
        break;
      case 1:
        bVar4 = BVar1 == func;
        break;
      case 2:
        bVar4 = BVar1 == cont;
        break;
      case 3:
        bVar4 = BVar1 == any;
        break;
      case 4:
        if (((long)pSVar2 << 0x3d | (ulong)(pSVar2 + -0x30) >> 3) < 6) {
          bVar4 = 0x27 >> ((byte)((ulong)(pSVar2 + -0x30) >> 3) & 0x1f);
          if ((this < (SubTyper *)0x7d) || ((bVar4 & 1) != 0)) break;
        }
        else if (this < (SubTyper *)0x7d) goto switchD_00cadd64_caseD_a;
        bVar4 = (*(uint *)(this + 0x30) & 0xfffffffe) == 2;
        break;
      case 5:
        bVar4 = pSVar2 == (SubTyper *)&DAT_00000058;
        break;
      case 6:
        bVar4 = pSVar2 == (SubTyper *)&DAT_00000058;
        if ((SubTyper *)0x7c < this && !(bool)bVar4) {
          bVar4 = *(int *)(this + 0x30) == 2;
        }
        break;
      case 7:
        bVar4 = pSVar2 == (SubTyper *)&DAT_00000058;
        if ((SubTyper *)0x7c < this && !(bool)bVar4) {
          bVar4 = *(int *)(this + 0x30) == 3;
        }
        break;
      case 8:
        bVar4 = BVar1 == exn;
        break;
      case 9:
        bVar4 = pSVar2 == (SubTyper *)0x60;
        break;
      case 10:
      case 0xb:
      case 0xc:
      case 0xd:
      case 0xe:
        goto switchD_00cadd64_caseD_a;
      default:
        goto switchD_00cadd64_default;
      }
      goto LAB_00cadd97;
    }
  }
  else if ((*(int *)(a.id + 4) == 0) == (uVar3 == 0)) {
switchD_00cadd64_default:
    if (this < (SubTyper *)0x7d) {
      BVar1 = HeapType::getBottom(&a_local);
      bVar4 = (SubTyper *)(ulong)BVar1 == this;
    }
    else {
      do {
        this = *(SubTyper **)(this + 8);
        bVar4 = this != (SubTyper *)0x0;
        if (this == (SubTyper *)0x0) break;
        if (a.id < 0x7d) {
          __assert_fail("!ht.isBasic()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                        ,0xe6,"HeapTypeInfo *wasm::(anonymous namespace)::getHeapTypeInfo(HeapType)"
                       );
        }
      } while (this != (SubTyper *)a.id);
    }
    goto LAB_00cadd97;
  }
switchD_00cadd64_caseD_a:
  bVar4 = 0;
LAB_00cadd97:
  return (bool)(bVar4 & 1);
}

Assistant:

bool SubTyper::isSubType(HeapType a, HeapType b) {
  // See:
  // https://github.com/WebAssembly/function-references/blob/master/proposals/function-references/Overview.md#subtyping
  // https://github.com/WebAssembly/gc/blob/master/proposals/gc/MVP.md#defined-types
  if (a == b) {
    return true;
  }
  if (a.isShared() != b.isShared()) {
    return false;
  }
  if (b.isBasic()) {
    auto aTop = a.getUnsharedTop();
    auto aUnshared = a.isBasic() ? a.getBasic(Unshared) : a;
    switch (b.getBasic(Unshared)) {
      case HeapType::ext:
        return aTop == HeapType::ext;
      case HeapType::func:
        return aTop == HeapType::func;
      case HeapType::cont:
        return aTop == HeapType::cont;
      case HeapType::exn:
        return aTop == HeapType::exn;
      case HeapType::any:
        return aTop == HeapType::any;
      case HeapType::eq:
        return aUnshared == HeapType::i31 || aUnshared == HeapType::none ||
               aUnshared == HeapType::struct_ || aUnshared == HeapType::array ||
               a.isStruct() || a.isArray();
      case HeapType::i31:
        return aUnshared == HeapType::none;
      case HeapType::string:
        return aUnshared == HeapType::noext;
      case HeapType::struct_:
        return aUnshared == HeapType::none || a.isStruct();
      case HeapType::array:
        return aUnshared == HeapType::none || a.isArray();
      case HeapType::none:
      case HeapType::noext:
      case HeapType::nofunc:
      case HeapType::nocont:
      case HeapType::noexn:
        return false;
    }
  }
  if (a.isBasic()) {
    // Basic HeapTypes are only subtypes of compound HeapTypes if they are
    // bottom types.
    return a == b.getBottom();
  }
  // Subtyping must be declared rather than derived from structure, so we will
  // not recurse. TODO: optimize this search with some form of caching.
  HeapTypeInfo* curr = getHeapTypeInfo(a);
  while ((curr = curr->supertype)) {
    if (curr == getHeapTypeInfo(b)) {
      return true;
    }
  }
  return false;
}